

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> __thiscall
mjs::parser::parse(parser *this)

{
  parser *in_RSI;
  source_extend local_230 [4];
  ostringstream oss;
  exception *e;
  undefined1 local_30 [8];
  statement_list l;
  parser *this_local;
  
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
            *)local_30);
  skip_whitespace(in_RSI);
  parse_statement_list((statement_list *)&e,in_RSI,1 < (int)in_RSI->version_);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::operator=((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
               *)local_30,
              (vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
               *)&e);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             *)&e);
  expect_semicolon_allow_insertion(in_RSI,"parse",0x101);
  std::shared_ptr<mjs::source_file>::shared_ptr(&local_230[0].file,&in_RSI->source_);
  local_230[0].start = 0;
  local_230[0].end = lexer::text_position(&in_RSI->lexer_);
  std::
  make_unique<mjs::block_statement,mjs::source_extend,std::vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>,bool&>
            ((source_extend *)this,
             (vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
              *)local_230,(bool *)local_30);
  source_extend::~source_extend(local_230);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             *)local_30);
  return (__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
          )(__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<block_statement> parse() {

#ifdef PARSER_DEBUG
        std::wcout << "\nParsing '" << source_->text() << "'\n\n";
#endif

        statement_list l;

        try {
            skip_whitespace();
            l = parse_statement_list(version_ >= version::es5);
            EXPECT_SEMICOLON_ALLOW_INSERTION();
        } catch (const std::exception& e) {
            std::ostringstream oss;
            oss << source_extend{source_, token_start_, lexer_.text_position()} << ": " << e.what();
            throw std::runtime_error(oss.str());
        }

#ifdef PARSER_DEBUG
        std::wcout << "\n\n";
#endif
        return std::make_unique<block_statement>(source_extend{source_, 0, lexer_.text_position()}, std::move(l), strict_mode_);
    }